

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

void __thiscall capnp::DynamicList::Builder::set(Builder *this,uint index,Reader *value)

{
  uint uVar1;
  byte *pbVar2;
  double dVar3;
  StructReader other;
  uint *puVar4;
  undefined8 uVar5;
  ReaderFor<bool> RVar6;
  bool bVar7;
  uint8_t uVar8;
  Which WVar9;
  uint16_t uVar10;
  uint32_t uVar11;
  StructSchema SVar12;
  uint64_t uVar13;
  InterfaceSchema other_00;
  DebugComparison<unsigned_int_&,_unsigned_int> *this_00;
  byte bVar14;
  float fVar15;
  ReaderFor<Text> value_00;
  StringPtr name;
  Reader value_01;
  ReaderFor<DynamicEnum> RVar16;
  uint index_local;
  DebugComparison<unsigned_int_&,_unsigned_int> _kjCondition;
  WirePointer *local_a0;
  undefined8 uStack_98;
  Fault f;
  Fault f_1;
  Type local_38;
  
  _kjCondition.left = &index_local;
  uVar1 = (this->builder).elementCount;
  _kjCondition.right = uVar1;
  _kjCondition.op.content.ptr = " < ";
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = index < uVar1;
  index_local = index;
  if (uVar1 <= index) {
    this_00 = (DebugComparison<unsigned_int_&,_unsigned_int> *)&f;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int>&,char_const(&)[26]>
              ((Fault *)this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x48a,FAILED,"index < size()","_kjCondition,\"List index out-of-bounds.\"",
               &_kjCondition,(char (*) [26])"List index out-of-bounds.");
    goto LAB_001b94ea;
  }
  WVar9 = LIST;
  if ((this->schema).elementType.listDepth == '\0') {
    WVar9 = (this->schema).elementType.baseType;
  }
  switch(WVar9) {
  case VOID:
    DynamicValue::Reader::AsImpl<capnp::Void,_(capnp::Kind)0>::apply(value);
    break;
  case BOOL:
    RVar6 = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply(value);
    pbVar2 = (this->builder).ptr;
    bVar14 = (byte)index & 7;
    pbVar2[index >> 3] = RVar6 << bVar14 | pbVar2[index >> 3] & ~(byte)(1 << bVar14);
    break;
  case INT8:
    uVar8 = DynamicValue::Reader::AsImpl<signed_char,_(capnp::Kind)0>::apply(value);
    goto LAB_001b98c5;
  case INT16:
    uVar10 = DynamicValue::Reader::AsImpl<short,_(capnp::Kind)0>::apply(value);
    goto LAB_001b972f;
  case INT32:
    uVar11 = DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply(value);
    goto LAB_001b9945;
  case INT64:
    uVar13 = DynamicValue::Reader::AsImpl<long,_(capnp::Kind)0>::apply(value);
    goto LAB_001b9865;
  case UINT8:
    uVar8 = DynamicValue::Reader::AsImpl<unsigned_char,_(capnp::Kind)0>::apply(value);
LAB_001b98c5:
    (this->builder).ptr[(ulong)(this->builder).step * (ulong)index >> 3] = uVar8;
    break;
  case UINT16:
    uVar10 = DynamicValue::Reader::AsImpl<unsigned_short,_(capnp::Kind)0>::apply(value);
LAB_001b972f:
    *(uint16_t *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3)) = uVar10;
    break;
  case UINT32:
    uVar11 = DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply(value);
LAB_001b9945:
    *(uint32_t *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3)) = uVar11;
    break;
  case UINT64:
    uVar13 = DynamicValue::Reader::AsImpl<unsigned_long,_(capnp::Kind)0>::apply(value);
LAB_001b9865:
    *(uint64_t *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3)) = uVar13;
    break;
  case FLOAT32:
    fVar15 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply(value);
    *(float *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3)) = fVar15;
    break;
  case FLOAT64:
    dVar3 = DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply(value);
    *(double *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3)) = dVar3;
    break;
  case TEXT:
    _kjCondition.op.content.ptr =
         (char *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3));
    _kjCondition.left = (uint *)(this->builder).segment;
    _kjCondition._8_8_ = (this->builder).capTable;
    value_00 = DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply(value);
    _::PointerBuilder::setBlob<capnp::Text>
              ((PointerBuilder *)&_kjCondition,(Reader)value_00.super_StringPtr.content);
    break;
  case DATA:
    _kjCondition.op.content.ptr =
         (char *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3));
    _kjCondition.left = (uint *)(this->builder).segment;
    _kjCondition._8_8_ = (this->builder).capTable;
    value_01 = DynamicValue::Reader::AsImpl<capnp::Data,_(capnp::Kind)1>::apply(value);
    _::PointerBuilder::setBlob<capnp::Data>((PointerBuilder *)&_kjCondition,value_01);
    break;
  case LIST:
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&_kjCondition,value);
    f_1.exception = (Exception *)_kjCondition.left;
    local_38 = (Type)Type::asList((Type *)this);
    bVar7 = Type::operator==((Type *)&f_1,&local_38);
    f = f_1;
    if (bVar7) {
      f.exception = (Exception *)(this->builder).segment;
      _::PointerBuilder::setList((PointerBuilder *)&f,(ListReader *)&_kjCondition.op,false);
      return;
    }
    this_00 = (DebugComparison<unsigned_int_&,_unsigned_int> *)&f_1;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ListSchema,capnp::ListSchema>&,char_const(&)[21]>
              ((Fault *)this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x4ab,FAILED,"listValue.getSchema() == schema.getListElementType()",
               "_kjCondition,\"Value type mismatch.\"",
               (DebugComparison<capnp::ListSchema,_capnp::ListSchema> *)&f,
               (char (*) [21])"Value type mismatch.");
    goto LAB_001b94ea;
  case ENUM:
    if (value->type == TEXT) {
      f.exception = (Exception *)Type::asEnum((Type *)this);
      name.content = (ArrayPtr<const_char>)
                     DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply(value);
      EnumSchema::getEnumerantByName((Enumerant *)&_kjCondition,(EnumSchema *)&f,name);
      uVar10 = (uint16_t)_kjCondition.right;
    }
    else {
      RVar16 = DynamicValue::Reader::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply(value);
      uVar10 = RVar16.value;
      _kjCondition.left = (uint *)Type::asEnum((Type *)this);
      _kjCondition.op.content.ptr = " == ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result =
           (RawBrandedSchema *)_kjCondition.left ==
           (RawBrandedSchema *)RVar16.schema.super_Schema.raw;
      if (!_kjCondition.result) {
        _kjCondition._8_8_ = (RawBrandedSchema *)RVar16.schema.super_Schema.raw;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::EnumSchema,capnp::EnumSchema>&,char_const(&)[54]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                   ,0x4c3,FAILED,"schema.getEnumElementType() == enumValue.getSchema()",
                   "_kjCondition,\"Type mismatch when using DynamicList::Builder::set().\"",
                   (DebugComparison<capnp::EnumSchema,_capnp::EnumSchema> *)&_kjCondition,
                   (char (*) [54])"Type mismatch when using DynamicList::Builder::set().");
        kj::_::Debug::Fault::~Fault(&f);
        return;
      }
    }
    *(uint16_t *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index_local >> 3)) =
         uVar10;
    break;
  case STRUCT:
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicStruct> *)&_kjCondition,value);
    puVar4 = _kjCondition.left;
    SVar12 = Type::asStruct((Type *)this);
    f.exception = (Exception *)puVar4;
    if ((Schema)puVar4 == SVar12.super_Schema.raw) {
      _::ListBuilder::getStructElement((StructBuilder *)&f,&this->builder,index_local);
      other.pointers._1_7_ = _kjCondition._33_7_;
      other.pointers._0_1_ = _kjCondition.result;
      other.capTable = (CapTableReader *)_kjCondition.op.content.ptr;
      other.segment = (SegmentReader *)_kjCondition._8_8_;
      other.data = (void *)_kjCondition.op.content.size_;
      other._32_8_ = local_a0;
      other._40_8_ = uStack_98;
      _::StructBuilder::copyContentFrom((StructBuilder *)&f,other);
      return;
    }
    this_00 = (DebugComparison<unsigned_int_&,_unsigned_int> *)&f_1;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::StructSchema,capnp::StructSchema>&,char_const(&)[21]>
              ((Fault *)this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x4b4,FAILED,"structValue.getSchema() == schema.getStructElementType()",
               "_kjCondition,\"Value type mismatch.\"",
               (DebugComparison<capnp::StructSchema,_capnp::StructSchema> *)&f,
               (char (*) [21])"Value type mismatch.");
    goto LAB_001b94ea;
  case INTERFACE:
    DynamicValue::Reader::AsImpl<capnp::DynamicCapability,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicCapability> *)&_kjCondition,value);
    f.exception = (Exception *)_kjCondition.op.content.ptr;
    other_00 = Type::asInterface((Type *)this);
    bVar7 = InterfaceSchema::extends((InterfaceSchema *)&f,other_00);
    f_1.exception._0_1_ = bVar7;
    if (bVar7) {
LAB_001b97fe:
      f.exception = (Exception *)(this->builder).segment;
      _::PointerBuilder::setCapability
                ((PointerBuilder *)&f,(Own<capnp::ClientHook,_std::nullptr_t> *)&_kjCondition);
    }
    else {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[21]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x4d4,FAILED,"capValue.getSchema().extends(schema.getInterfaceElementType())",
                 "_kjCondition,\"Value type mismatch.\"",(DebugExpression<bool> *)&f_1,
                 (char (*) [21])"Value type mismatch.");
      kj::_::Debug::Fault::~Fault(&f);
      if (bVar7) goto LAB_001b97fe;
    }
    uVar5 = _kjCondition._8_8_;
    if (_kjCondition._8_8_ != 0) {
      _kjCondition.right = 0;
      _kjCondition._12_4_ = 0;
      (*(code *)**(undefined8 **)_kjCondition.left)
                (_kjCondition.left,uVar5 + *(long *)(*(long *)uVar5 + -0x10));
    }
    break;
  case ANY_POINTER:
    this_00 = &_kjCondition;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
              ((Fault *)this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x4cd,FAILED,(char *)0x0,"\"List(AnyPointer) not supported.\"",
               (char (*) [32])"List(AnyPointer) not supported.");
    goto LAB_001b94ea;
  default:
    f.exception._0_4_ = (uint)WVar9;
    this_00 = &_kjCondition;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[34],unsigned_int>
              ((Fault *)this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x4dc,FAILED,(char *)0x0,
               "\"can\'t set element of unknown type\", (uint)schema.whichElementType()",
               (char (*) [34])"can\'t set element of unknown type",(uint *)&f);
LAB_001b94ea:
    kj::_::Debug::Fault::~Fault((Fault *)this_00);
  }
  return;
}

Assistant:

void DynamicList::Builder::set(uint index, const DynamicValue::Reader& value) {
  KJ_REQUIRE(index < size(), "List index out-of-bounds.") {
    return;
  }

  switch (schema.whichElementType()) {
#define HANDLE_TYPE(name, discrim, typeName) \
    case schema::Type::discrim: \
      builder.setDataElement<typeName>(bounded(index) * ELEMENTS, value.as<typeName>()); \
      return;

    HANDLE_TYPE(void, VOID, Void)
    HANDLE_TYPE(bool, BOOL, bool)
    HANDLE_TYPE(int8, INT8, int8_t)
    HANDLE_TYPE(int16, INT16, int16_t)
    HANDLE_TYPE(int32, INT32, int32_t)
    HANDLE_TYPE(int64, INT64, int64_t)
    HANDLE_TYPE(uint8, UINT8, uint8_t)
    HANDLE_TYPE(uint16, UINT16, uint16_t)
    HANDLE_TYPE(uint32, UINT32, uint32_t)
    HANDLE_TYPE(uint64, UINT64, uint64_t)
    HANDLE_TYPE(float32, FLOAT32, float)
    HANDLE_TYPE(float64, FLOAT64, double)
#undef HANDLE_TYPE

    case schema::Type::TEXT:
      builder.getPointerElement(bounded(index) * ELEMENTS).setBlob<Text>(value.as<Text>());
      return;
    case schema::Type::DATA:
      builder.getPointerElement(bounded(index) * ELEMENTS).setBlob<Data>(value.as<Data>());
      return;

    case schema::Type::LIST: {
      auto listValue = value.as<DynamicList>();
      KJ_REQUIRE(listValue.getSchema() == schema.getListElementType(), "Value type mismatch.") {
        return;
      }
      builder.getPointerElement(bounded(index) * ELEMENTS).setList(listValue.reader);
      return;
    }

    case schema::Type::STRUCT: {
      auto structValue = value.as<DynamicStruct>();
      KJ_REQUIRE(structValue.getSchema() == schema.getStructElementType(), "Value type mismatch.") {
        return;
      }
      builder.getStructElement(bounded(index) * ELEMENTS).copyContentFrom(structValue.reader);
      return;
    }

    case schema::Type::ENUM: {
      uint16_t rawValue;
      if (value.getType() == DynamicValue::TEXT) {
        // Convert from text.
        rawValue = schema.getEnumElementType().getEnumerantByName(value.as<Text>()).getOrdinal();
      } else {
        DynamicEnum enumValue = value.as<DynamicEnum>();
        KJ_REQUIRE(schema.getEnumElementType() == enumValue.getSchema(),
                   "Type mismatch when using DynamicList::Builder::set().") {
          return;
        }
        rawValue = enumValue.getRaw();
      }
      builder.setDataElement<uint16_t>(bounded(index) * ELEMENTS, rawValue);
      return;
    }

    case schema::Type::ANY_POINTER:
      KJ_FAIL_ASSERT("List(AnyPointer) not supported.") {
        return;
      }

    case schema::Type::INTERFACE: {
      auto capValue = value.as<DynamicCapability>();
      KJ_REQUIRE(capValue.getSchema().extends(schema.getInterfaceElementType()),
                 "Value type mismatch.") {
        return;
      }
      builder.getPointerElement(bounded(index) * ELEMENTS).setCapability(kj::mv(capValue.hook));
      return;
    }
  }

  KJ_FAIL_REQUIRE("can't set element of unknown type", (uint)schema.whichElementType()) {
    return;
  }
}